

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TrapMode.cpp
# Opt level: O0

void wasm::makeClampLimitLiterals<int,double>(Literal *iMin,Literal *fMin,Literal *fMax)

{
  Literal local_80;
  Literal local_68;
  Literal local_40;
  int local_28;
  int32_t local_24;
  int maxVal;
  int minVal;
  Literal *fMax_local;
  Literal *fMin_local;
  Literal *iMin_local;
  
  _maxVal = fMax;
  fMax_local = fMin;
  fMin_local = iMin;
  local_24 = std::numeric_limits<int>::min();
  local_28 = std::numeric_limits<int>::max();
  Literal::Literal(&local_40,local_24);
  Literal::operator=(fMin_local,&local_40);
  Literal::~Literal(&local_40);
  Literal::Literal(&local_68,(double)local_24 + -1.0);
  Literal::operator=(fMax_local,&local_68);
  Literal::~Literal(&local_68);
  Literal::Literal(&local_80,(double)local_28 + 1.0);
  Literal::operator=(_maxVal,&local_80);
  Literal::~Literal(&local_80);
  return;
}

Assistant:

void makeClampLimitLiterals(Literal& iMin, Literal& fMin, Literal& fMax) {
  IntType minVal = std::numeric_limits<IntType>::min();
  IntType maxVal = std::numeric_limits<IntType>::max();
  iMin = Literal(minVal);
  fMin = Literal(FloatType(minVal) - 1);
  fMax = Literal(FloatType(maxVal) + 1);
}